

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcb.c
# Opt level: O1

int envy_bios_parse_dcb(envy_bios *bios)

{
  ushort uVar1;
  uint8_t *puVar2;
  envy_bios_dcb_entry *peVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  envy_bios_dcb_entry *peVar15;
  long lVar16;
  ulong uVar17;
  byte bVar18;
  uint uVar19;
  char *__format;
  uint8_t uVar20;
  byte bVar21;
  uint uVar22;
  ulong uVar23;
  bool bVar24;
  uint8_t dev_rec [7];
  byte local_46 [10];
  uint local_3c;
  envy_bios_dcb *local_38;
  
  uVar1 = (bios->dcb).offset;
  if (uVar1 == 0) {
    return 0;
  }
  if (bios->length <= (uint)uVar1) {
    (bios->dcb).version = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)(uint)uVar1);
    goto LAB_002557e6;
  }
  (bios->dcb).version = bios->data[(uint)uVar1];
  bVar18 = (bios->dcb).version;
  switch(bVar18) {
  case 0x10:
  case 0x11:
    (bios->dcb).rlen = '\0';
    (bios->dcb).version = '\0';
    (bios->dcb).hlen = '\0';
    bios->odcb_offset = (uint)(bios->dcb).offset;
    (bios->dcb).offset = 0;
    return 0;
  case 0x12:
    (bios->dcb).hlen = '\x04';
    (bios->dcb).entriesnum = '\x10';
    (bios->dcb).rlen = '\b';
    lVar16 = (ulong)(bios->dcb).offset + 1;
    if ((uint)lVar16 < bios->length) {
      bVar18 = bios->data[lVar16];
      uVar4 = 0;
    }
    else {
      bVar18 = 0;
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar4 = 0xfffffff2;
    }
    uVar17 = (ulong)(bios->dcb).offset;
    lVar16 = uVar17 + 3;
    if ((uint)lVar16 < bios->length) {
      (bios->i2c).offset = CONCAT11(bios->data[lVar16],bios->data[uVar17 + 2]);
      uVar22 = 0;
    }
    else {
      (bios->i2c).offset = 0;
      fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
      uVar22 = 0xfffffff2;
    }
    uVar22 = uVar22 | uVar4;
    (bios->i2c).def[0] = bVar18 & 0xf;
    (bios->i2c).def[1] = bVar18 >> 4;
    uVar4 = (bios->dcb).offset - 0x80;
    bios->odcb_offset = uVar4;
    envy_bios_block(bios,uVar4,0x80,"ODCB",-1);
    uVar19 = 8;
    break;
  case 0x13:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
    goto switchD_00255166_caseD_13;
  case 0x14:
  case 0x15:
    (bios->dcb).hlen = '\x04';
    (bios->dcb).entriesnum = '\x10';
    (bios->dcb).rlen = '\n';
    lVar16 = (ulong)(bios->dcb).offset + 1;
    if ((uint)lVar16 < bios->length) {
      bVar18 = bios->data[lVar16];
      uVar4 = 0;
    }
    else {
      bVar18 = 0;
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar4 = 0xfffffff2;
    }
    uVar17 = (ulong)(bios->dcb).offset;
    lVar16 = uVar17 + 3;
    if ((uint)lVar16 < bios->length) {
      (bios->i2c).offset = CONCAT11(bios->data[lVar16],bios->data[uVar17 + 2]);
      uVar22 = 0;
    }
    else {
      (bios->i2c).offset = 0;
      fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
      uVar22 = 0xfffffff2;
    }
    uVar22 = uVar22 | uVar4;
    (bios->i2c).def[0] = bVar18 & 0xf;
    (bios->i2c).def[1] = bVar18 >> 4;
    uVar19 = 10;
    break;
  case 0x20:
  case 0x21:
  case 0x22:
    (bios->dcb).hlen = '\b';
    (bios->dcb).entriesnum = '\x10';
    (bios->dcb).rlen = '\b';
    lVar16 = (ulong)(bios->dcb).offset + 1;
    if ((uint)lVar16 < bios->length) {
      bVar18 = bios->data[lVar16];
      uVar4 = 0;
    }
    else {
      bVar18 = 0;
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar4 = 0xfffffff2;
    }
    uVar17 = (ulong)(bios->dcb).offset;
    lVar16 = uVar17 + 3;
    if ((uint)lVar16 < bios->length) {
      (bios->i2c).offset = CONCAT11(bios->data[lVar16],bios->data[uVar17 + 2]);
      uVar19 = 0;
    }
    else {
      (bios->i2c).offset = 0;
      fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
      uVar19 = 0xfffffff2;
    }
    uVar17 = (ulong)(bios->dcb).offset;
    if ((uint)(uVar17 + 7) < bios->length) {
      puVar2 = bios->data;
      bVar24 = CONCAT13(puVar2[uVar17 + 7],
                        CONCAT12(puVar2[uVar17 + 6],*(undefined2 *)(puVar2 + uVar17 + 4))) ==
               0x4edcbdcb;
      uVar22 = 0;
    }
    else {
      bVar24 = false;
      fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
      uVar22 = 0xfffffff2;
    }
    if (bVar24) {
      uVar22 = uVar19 | uVar4 | uVar22;
      (bios->i2c).def[0] = bVar18 & 0xf;
      (bios->i2c).def[1] = bVar18 >> 4;
      uVar4 = 8;
      uVar19 = 8;
      goto LAB_002556f5;
    }
    envy_bios_parse_dcb_cold_2();
    goto LAB_00256034;
  default:
    uVar4 = bVar18 - 0x30;
    if ((uVar4 < 0x12) && ((0x30001U >> (uVar4 & 0x1f) & 1) != 0)) {
      lVar16 = (ulong)(bios->dcb).offset + 1;
      if ((uint)lVar16 < bios->length) {
        (bios->dcb).hlen = bios->data[lVar16];
        uVar4 = 0;
      }
      else {
        (bios->dcb).hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar4 = 0xfffffff2;
      }
      lVar16 = (ulong)(bios->dcb).offset + 2;
      if ((uint)lVar16 < bios->length) {
        (bios->dcb).entriesnum = bios->data[lVar16];
        uVar19 = 0;
      }
      else {
        (bios->dcb).entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar19 = 0xfffffff2;
      }
      lVar16 = (ulong)(bios->dcb).offset + 3;
      if ((uint)lVar16 < bios->length) {
        (bios->dcb).rlen = bios->data[lVar16];
        uVar5 = 0;
      }
      else {
        (bios->dcb).rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar5 = 0xfffffff2;
      }
      uVar17 = (ulong)(bios->dcb).offset;
      lVar16 = uVar17 + 5;
      if ((uint)lVar16 < bios->length) {
        (bios->i2c).offset = CONCAT11(bios->data[lVar16],bios->data[uVar17 + 4]);
        uVar6 = 0;
      }
      else {
        (bios->i2c).offset = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        uVar6 = 0xfffffff2;
      }
      uVar17 = (ulong)(bios->dcb).offset;
      if ((uint)(uVar17 + 9) < bios->length) {
        puVar2 = bios->data;
        bVar24 = CONCAT13(puVar2[uVar17 + 9],
                          CONCAT12(puVar2[uVar17 + 8],*(undefined2 *)(puVar2 + uVar17 + 6))) ==
                 0x4edcbdcb;
        uVar7 = 0;
      }
      else {
        bVar24 = false;
        fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
        uVar7 = 0xfffffff2;
      }
      uVar17 = (ulong)(bios->dcb).offset;
      lVar16 = uVar17 + 0xb;
      if ((uint)lVar16 < bios->length) {
        (bios->gpio).offset = CONCAT11(bios->data[lVar16],bios->data[uVar17 + 10]);
        uVar8 = 0;
      }
      else {
        (bios->gpio).offset = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        uVar8 = 0xfffffff2;
      }
      uVar17 = (ulong)(bios->dcb).offset;
      lVar16 = uVar17 + 0xd;
      if ((uint)lVar16 < bios->length) {
        (bios->inputdev).offset = CONCAT11(bios->data[lVar16],bios->data[uVar17 + 0xc]);
        uVar9 = 0;
      }
      else {
        (bios->inputdev).offset = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        uVar9 = 0xfffffff2;
      }
      uVar17 = (ulong)(bios->dcb).offset;
      lVar16 = uVar17 + 0xf;
      if ((uint)lVar16 < bios->length) {
        (bios->cinema).offset = CONCAT11(bios->data[lVar16],bios->data[uVar17 + 0xe]);
        uVar10 = 0;
      }
      else {
        (bios->cinema).offset = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        uVar10 = 0xfffffff2;
      }
      uVar17 = (ulong)(bios->dcb).offset;
      lVar16 = uVar17 + 0x11;
      if ((uint)lVar16 < bios->length) {
        (bios->spreadspectrum).offset = CONCAT11(bios->data[lVar16],bios->data[uVar17 + 0x10]);
        uVar11 = 0;
      }
      else {
        (bios->spreadspectrum).offset = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        uVar11 = 0xfffffff2;
      }
      uVar17 = (ulong)(bios->dcb).offset;
      lVar16 = uVar17 + 0x13;
      if ((uint)lVar16 < bios->length) {
        (bios->extdev).offset = CONCAT11(bios->data[lVar16],bios->data[uVar17 + 0x12]);
        uVar12 = 0;
      }
      else {
        (bios->extdev).offset = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        uVar12 = 0xfffffff2;
      }
      uVar17 = (ulong)(bios->dcb).offset;
      lVar16 = uVar17 + 0x15;
      if ((uint)lVar16 < bios->length) {
        (bios->conn).offset = CONCAT11(bios->data[lVar16],bios->data[uVar17 + 0x14]);
        uVar13 = 0;
      }
      else {
        (bios->conn).offset = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        uVar13 = 0xfffffff2;
      }
      lVar16 = (ulong)(bios->dcb).offset + 0x16;
      if ((uint)lVar16 < bios->length) {
        (bios->dcb).unk16 = bios->data[lVar16];
        uVar22 = 0;
      }
      else {
        (bios->dcb).unk16 = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar22 = 0xfffffff2;
      }
      uVar22 = uVar19 | uVar4 | uVar5 | uVar6 | uVar7 | uVar8 | uVar9 | uVar10 | uVar11 | uVar12 |
               uVar13 | uVar22;
      uVar4 = 0x17;
      if (0x18 < (bios->dcb).hlen) {
        uVar17 = (ulong)(bios->dcb).offset;
        lVar16 = uVar17 + 0x18;
        if ((uint)lVar16 < bios->length) {
          (bios->hdtvtt).offset = CONCAT11(bios->data[lVar16],bios->data[uVar17 + 0x17]);
          uVar4 = 0;
        }
        else {
          (bios->hdtvtt).offset = 0;
          fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
          uVar4 = 0xfffffff2;
        }
        uVar22 = uVar22 | uVar4;
        uVar4 = 0x19;
      }
      if (0x1a < (bios->dcb).hlen) {
        uVar17 = (ulong)(bios->dcb).offset;
        lVar16 = uVar17 + 0x1a;
        if ((uint)lVar16 < bios->length) {
          (bios->mux).offset = CONCAT11(bios->data[lVar16],bios->data[uVar17 + 0x19]);
          uVar4 = 0;
        }
        else {
          (bios->mux).offset = 0;
          fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
          uVar4 = 0xfffffff2;
        }
        uVar22 = uVar22 | uVar4;
        uVar4 = 0x1b;
      }
      uVar19 = 8;
      if (bVar24) goto LAB_002556f5;
      envy_bios_parse_dcb_cold_1();
      goto LAB_00256034;
    }
    goto switchD_00255166_caseD_13;
  }
  uVar4 = 4;
LAB_002556f5:
  envy_bios_block(bios,(uint)(bios->dcb).offset,
                  (uint)(bios->dcb).entriesnum * (uint)(bios->dcb).rlen + (uint)(bios->dcb).hlen,
                  "DCB",-1);
  if ((byte)((bios->dcb).version - 0x14) < 0x1c) {
    local_38 = &bios->dcb;
    lVar16 = 0;
    local_3c = uVar19;
    do {
      uVar17 = (lVar16 + (ulong)(bios->dcb).offset) - 7;
      if ((uint)uVar17 < bios->length) {
        local_46[lVar16] = bios->data[uVar17 & 0xffffffff];
        uVar19 = 0;
      }
      else {
        local_46[lVar16] = 0;
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar19 = 0xfffffff2;
      }
      uVar22 = uVar22 | uVar19;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 7);
    if ((uVar22 == 0) &&
       (CONCAT13(local_46[6],CONCAT12(local_46[5],CONCAT11(local_46[4],local_46[3]))) == 0x4345525f
        && CONCAT13(local_46[3],CONCAT12(local_46[2],CONCAT11(local_46[1],local_46[0]))) ==
           0x5f564544)) {
      uVar1 = (bios->dcb).offset;
      uVar19 = uVar1 - 7;
      bios->dev_rec_offset = uVar19;
      bios->odcb_offset = uVar1 - 0x87;
      envy_bios_block(bios,uVar19,7,"DEV_REC",-1);
      envy_bios_block(bios,bios->odcb_offset,0x80,"ODCB",-1);
      uVar19 = local_3c;
    }
    else {
      iVar14 = envy_bios_parse_rdcb(bios);
      uVar19 = local_3c;
      if (iVar14 != 0) {
        envy_bios_parse_dcb_cold_3();
      }
    }
  }
  if (uVar22 == 0) {
    bVar18 = (bios->dcb).hlen;
    if (bVar18 < uVar4) {
      __format = "DCB table header too short [%d < %d]\n";
    }
    else {
      bVar21 = (bios->dcb).rlen;
      if (uVar19 <= bVar21) {
        if (uVar4 < bVar18) {
          fprintf(_stderr,"DCB table header longer than expected [%d > %d]\n");
        }
        if (uVar19 < (bios->dcb).rlen) {
          fprintf(_stderr,"DCB table record longer than expected [%d > %d]\n");
        }
        peVar15 = (envy_bios_dcb_entry *)calloc((ulong)(bios->dcb).entriesnum,0x20);
        (bios->dcb).entries = peVar15;
        if (peVar15 == (envy_bios_dcb_entry *)0x0) {
          return -0xc;
        }
        if ((bios->dcb).entriesnum != '\0') {
          uVar17 = 0;
          uVar4 = 0;
          do {
            peVar3 = (bios->dcb).entries;
            peVar15 = peVar3 + uVar17;
            peVar3[uVar17].offset =
                 (ushort)(bios->dcb).rlen * (short)uVar17 +
                 (ushort)(bios->dcb).hlen + (bios->dcb).offset;
            uVar23 = 0;
            do {
              uVar19 = uVar4;
              if ((bios->dcb).rlen <= uVar23) break;
              if ((int)uVar23 + (uint)peVar15->offset < bios->length) {
                local_46[uVar23] = bios->data[uVar23 + peVar15->offset];
                uVar5 = 0;
              }
              else {
                local_46[uVar23] = 0;
                fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                uVar5 = 0xfffffff2;
              }
              uVar19 = 0;
              uVar4 = uVar5 | uVar4;
              if (uVar4 != 0) {
                bVar24 = false;
                goto LAB_00255b56;
              }
              uVar23 = uVar23 + 1;
              uVar4 = 0;
            } while (uVar23 != 10);
            bVar18 = (bios->dcb).version;
            if (bVar18 < 0x20) {
              if (0x13 < bVar18) {
                peVar15->type = local_46[0] & 0xf;
                peVar15->unk00_4 = local_46[0] >> 4;
                peVar15->i2c = local_46[2] * '\x04' & 0xf | local_46[1] >> 6;
                uVar20 = '\x01' << (local_46[2] >> 2 & 7);
                peVar15->or = uVar20;
                peVar15->heads = uVar20;
                peVar15->loc = local_46[2] >> 5;
                peVar15->conntag = local_46[3] >> 1 & 7;
                if ((local_46[0] & 0xf) == 0) {
                  peVar15->maxfreq = (uint)CONCAT11(local_46[7],local_46[6]) * 10;
                }
              }
            }
            else {
              uVar4 = local_46[0] & 0xf;
              peVar15->type = (byte)uVar4;
              peVar15->i2c = local_46[0] >> 4;
              peVar15->heads = local_46[1] & 0xf;
              (&peVar15->conn)[(ulong)(bVar18 < 0x30) * 2] = local_46[1] >> 4;
              peVar15->conntag = local_46[2] & 0xf;
              peVar15->loc = local_46[2] >> 4 & 3;
              peVar15->unk02_6 = local_46[2] >> 6;
              peVar15->or = local_46[3] & 0xf;
              peVar15->unk03_4 = local_46[3] >> 4;
              peVar15->unk04 = local_46[4];
              peVar15->unk05 = local_46[5];
              peVar15->unk06 = local_46[6];
              peVar15->unk07 = local_46[7];
              if (uVar4 < 7) {
                switch(uVar4) {
                case 0:
                  if (bVar18 < 0x30) {
                    peVar15->maxfreq = ((uint)local_46[5] * 0x200 + (uint)local_46[4] * 2) * 5;
                    peVar15->unk04 = '\0';
                    peVar15->unk05 = '\0';
                  }
                  else {
                    peVar15->maxfreq = (uint)local_46[4] * 10000;
                    peVar15->unk04 = '\0';
                  }
                  break;
                default:
                  goto switchD_002559c6_caseD_1;
                case 2:
                  if (bVar18 < 0x30) {
                    peVar15->ext_addr = local_46[4] >> 4;
                    bVar21 = local_46[4] & 0xf;
                    goto LAB_00255abb;
                  }
                  peVar15->ext_addr = local_46[5];
                  peVar15->unk05 = '\0';
                  peVar15->tmds_hdmi = local_46[6] >> 1 & 1;
                  peVar15->unk06 = local_46[6] & 0xfd;
                  break;
                case 3:
                  peVar15->lvds_info = local_46[4] & 3;
                  peVar15->lvds_pscript = local_46[4] >> 2 & 3;
                  bVar21 = local_46[4] & 0xf0;
LAB_00255abb:
                  peVar15->unk04 = bVar21;
                  break;
                case 6:
                  peVar15->ext_addr = local_46[5];
                  peVar15->unk05 = '\0';
                  peVar15->dp_bw = local_46[6] >> 5;
                  peVar15->unk06 = local_46[6] & 0x1f;
                  peVar15->dp_lanes = local_46[7] & 0xf;
                  peVar15->unk07 = local_46[7] & 0xf0;
                }
                if ((((byte)uVar4 < 7) && ((0x4cU >> uVar4 & 1) != 0)) && (0x3f < bVar18)) {
                  peVar15->unk04 = peVar15->unk04 & 0xcf;
                  peVar15->links = local_46[4] >> 4 & 3;
                  peVar15->unk06 = peVar15->unk06 & 0xfd;
                }
              }
            }
switchD_002559c6_caseD_1:
            bVar24 = true;
            uVar4 = uVar19;
LAB_00255b56:
            if (!bVar24) goto LAB_002557e6;
            uVar17 = uVar17 + 1;
          } while (uVar17 < (bios->dcb).entriesnum);
        }
        (bios->dcb).valid = '\x01';
        iVar14 = envy_bios_parse_i2c(bios);
        if (iVar14 != 0) {
          envy_bios_parse_dcb_cold_4();
        }
        iVar14 = envy_bios_parse_gpio(bios);
        if (iVar14 != 0) {
          envy_bios_parse_dcb_cold_5();
        }
        iVar14 = envy_bios_parse_inputdev(bios);
        if (iVar14 != 0) {
          envy_bios_parse_dcb_cold_6();
        }
        iVar14 = envy_bios_parse_cinema(bios);
        if (iVar14 != 0) {
          envy_bios_parse_dcb_cold_7();
        }
        iVar14 = envy_bios_parse_spreadspectrum(bios);
        if (iVar14 != 0) {
          envy_bios_parse_dcb_cold_8();
        }
        iVar14 = envy_bios_parse_extdev(bios);
        if (iVar14 != 0) {
          envy_bios_parse_dcb_cold_9();
        }
        iVar14 = envy_bios_parse_conn(bios);
        if (iVar14 != 0) {
          envy_bios_parse_dcb_cold_10();
        }
        iVar14 = envy_bios_parse_hdtvtt(bios);
        if (iVar14 != 0) {
          envy_bios_parse_dcb_cold_11();
        }
        iVar14 = envy_bios_parse_mux(bios);
        if (iVar14 != 0) {
          envy_bios_parse_dcb_cold_12();
        }
        return 0;
      }
      __format = "DCB table record too short [%d < %d]\n";
      uVar4 = uVar19;
      bVar18 = bVar21;
    }
    fprintf(_stderr,__format,(ulong)bVar18,(ulong)uVar4);
LAB_00256034:
    iVar14 = -0x16;
  }
  else {
LAB_002557e6:
    iVar14 = -0xe;
  }
  return iVar14;
switchD_00255166_caseD_13:
  envy_bios_parse_dcb_cold_13();
  goto LAB_00256034;
}

Assistant:

int envy_bios_parse_dcb (struct envy_bios *bios) {
	struct envy_bios_dcb *dcb = &bios->dcb;
	if (!dcb->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, dcb->offset, &dcb->version);
	if (err)
		return -EFAULT;
	int wanthlen, wantrlen;
	uint32_t sig;
	uint8_t defs;
	switch (dcb->version) {
		case 0x10:
		case 0x11:
			/* old useless crap */
			wanthlen = dcb->hlen = 0;
			wantrlen = dcb->rlen = 0;
			dcb->version = 0;
			bios->odcb_offset = dcb->offset;
			dcb->offset = 0;
			return 0;
		case 0x12:
			wanthlen = dcb->hlen = 4;
			dcb->entriesnum = 16;
			wantrlen = dcb->rlen = 8;
			err |= bios_u8(bios, dcb->offset+1, &defs);
			err |= bios_u16(bios, dcb->offset+2, &bios->i2c.offset);
			bios->i2c.def[0] = defs & 0xf;
			bios->i2c.def[1] = defs >> 4;
			bios->odcb_offset = dcb->offset - 0x80;
			envy_bios_block(bios, bios->odcb_offset, 0x80, "ODCB", -1);
			break;
		case 0x14:
		case 0x15:
			wanthlen = dcb->hlen = 4;
			dcb->entriesnum = 16;
			wantrlen = dcb->rlen = 10;
			err |= bios_u8(bios, dcb->offset+1, &defs);
			err |= bios_u16(bios, dcb->offset+2, &bios->i2c.offset);
			bios->i2c.def[0] = defs & 0xf;
			bios->i2c.def[1] = defs >> 4;
			break;
		case 0x22:
		case 0x20:
		case 0x21:
			wanthlen = dcb->hlen = 8;
			dcb->entriesnum = 16;
			wantrlen = dcb->rlen = 8;
			err |= bios_u8(bios, dcb->offset+1, &defs);
			err |= bios_u16(bios, dcb->offset+2, &bios->i2c.offset);
			err |= bios_u32(bios, dcb->offset+4, &sig);
			if (sig != 0x4edcbdcb) {
				ENVY_BIOS_ERR("DCB sig mismatch\n");
				return -EINVAL;
			}
			bios->i2c.def[0] = defs & 0xf;
			bios->i2c.def[1] = defs >> 4;
			break;
		case 0x30:
		case 0x40:
		case 0x41:
			wanthlen = 23;
			wantrlen = 8;
			err |= bios_u8(bios, dcb->offset+1, &dcb->hlen);
			err |= bios_u8(bios, dcb->offset+2, &dcb->entriesnum);
			err |= bios_u8(bios, dcb->offset+3, &dcb->rlen);
			err |= bios_u16(bios, dcb->offset+4, &bios->i2c.offset);
			err |= bios_u32(bios, dcb->offset+6, &sig);
			err |= bios_u16(bios, dcb->offset+10, &bios->gpio.offset);
			err |= bios_u16(bios, dcb->offset+12, &bios->inputdev.offset);
			err |= bios_u16(bios, dcb->offset+14, &bios->cinema.offset);
			err |= bios_u16(bios, dcb->offset+16, &bios->spreadspectrum.offset);
			err |= bios_u16(bios, dcb->offset+18, &bios->extdev.offset);
			err |= bios_u16(bios, dcb->offset+20, &bios->conn.offset);
			err |= bios_u8(bios, dcb->offset+22, &dcb->unk16);
			if (dcb->hlen >= 25) {
				wanthlen = 25;
				err |= bios_u16(bios, dcb->offset+23, &bios->hdtvtt.offset);
			}
			if (dcb->hlen >= 27) {
				wanthlen = 27;
				err |= bios_u16(bios, dcb->offset+25, &bios->mux.offset);
			}
			if (sig != 0x4edcbdcb) {
				ENVY_BIOS_ERR("DCB sig mismatch\n");
				return -EINVAL;
			}
			break;
		default:
			ENVY_BIOS_ERR("Unknown DCB table version %d.%d\n", dcb->version >> 4, dcb->version & 0xf);
			return -EINVAL;
	}
	envy_bios_block(bios, dcb->offset, dcb->hlen + dcb->rlen * dcb->entriesnum, "DCB", -1);
	if (dcb->version >= 0x14 && dcb->version < 0x30) {
		uint8_t dev_rec[7];
		int j;
		for (j = 0; j < 7; j++)
			err |= bios_u8(bios, dcb->offset-7+j, &dev_rec[j]);
		if (!err && !memcmp(dev_rec, "DEV_REC", 7)) {
			bios->dev_rec_offset = dcb->offset - 7;
			bios->odcb_offset = bios->dev_rec_offset - 0x80;
			envy_bios_block(bios, bios->dev_rec_offset, 7, "DEV_REC", -1);
			envy_bios_block(bios, bios->odcb_offset, 0x80, "ODCB", -1);
		} else {
			if (envy_bios_parse_rdcb(bios))
				ENVY_BIOS_ERR("Failed to parse RDCB table at 0x%04x version %d.%d\n", bios->dcb.offset, bios->dcb.rdcb_version >> 4, bios->dcb.rdcb_version & 0xf);
		}
	}
	if (err)
		return -EFAULT;
	if (dcb->hlen < wanthlen) {
		ENVY_BIOS_ERR("DCB table header too short [%d < %d]\n", dcb->hlen, wanthlen);
		return -EINVAL;
	}
	if (dcb->rlen < wantrlen) {
		ENVY_BIOS_ERR("DCB table record too short [%d < %d]\n", dcb->rlen, wantrlen);
		return -EINVAL;
	}
	if (dcb->hlen > wanthlen) {
		ENVY_BIOS_WARN("DCB table header longer than expected [%d > %d]\n", dcb->hlen, wanthlen);
	}
	if (dcb->rlen > wantrlen) {
		ENVY_BIOS_WARN("DCB table record longer than expected [%d > %d]\n", dcb->rlen, wantrlen);
	}
	dcb->entries = calloc(dcb->entriesnum, sizeof *dcb->entries);
	if (!dcb->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < dcb->entriesnum; i++) {
		struct envy_bios_dcb_entry *entry = &dcb->entries[i];
		entry->offset = dcb->offset + dcb->hlen + dcb->rlen * i;
		uint8_t bytes[10];
		int j;
		for (j = 0; j < 10 && j < dcb->rlen; j++) {
			err |= bios_u8(bios, entry->offset+j, &bytes[j]);
			if (err)
				return -EFAULT;
		}
		if (dcb->version >= 0x20) {
			entry->type = bytes[0] & 0xf;
			entry->i2c = bytes[0] >> 4;
			entry->heads = bytes[1] & 0xf;
			if (dcb->version >= 0x30)
				entry->conn = bytes[1] >> 4;
			else
				entry->unk01_4 = bytes[1] >> 4;
			entry->conntag = bytes[2] & 0xf;
			entry->loc = bytes[2] >> 4 & 3;
			entry->unk02_6 = bytes[2] >> 6;
			entry->or = bytes[3] & 0xf;
			entry->unk03_4 = bytes[3] >> 4; /* seen used once on quadro, not sure if it means something */
			entry->unk04 = bytes[4];
			entry->unk05 = bytes[5];
			entry->unk06 = bytes[6];
			entry->unk07 = bytes[7];
			switch (entry->type) {
				case ENVY_BIOS_DCB_ANALOG:
					if (dcb->version < 0x30) {
						entry->maxfreq = (bytes[4] | bytes[5] << 8) * 10;
						entry->unk04 = 0;
						entry->unk05 = 0;
					} else {
						entry->maxfreq = bytes[4] * 10000;
						entry->unk04 = 0;
					}
					break;
				case ENVY_BIOS_DCB_TMDS:
					if (dcb->version < 0x30) {
						entry->ext_addr = bytes[4] >> 4;
						entry->unk04 &= ~0xf0;
					} else {
						entry->ext_addr = bytes[5];
						entry->unk05 = 0;
						entry->tmds_hdmi = !!(bytes[6] & 2);
						entry->unk06 &= ~2;
					}
					break;
				case ENVY_BIOS_DCB_LVDS:
					entry->lvds_info = bytes[4] & 3;
					entry->lvds_pscript = bytes[4] >> 2 & 3;
					entry->unk04 &= ~0xf;
					break;
				case ENVY_BIOS_DCB_DP:
					entry->ext_addr = bytes[5];
					entry->unk05 = 0;
					entry->dp_bw = bytes[6] >> 5;
					entry->unk06 &= ~0xe0;
					entry->dp_lanes = bytes[7] & 0xf;
					entry->unk07 &= ~0xf;
					break;
				/* XXX: TV */
				default:
					break;
			}
			if ((entry->type == ENVY_BIOS_DCB_LVDS || entry->type == ENVY_BIOS_DCB_TMDS || entry->type == ENVY_BIOS_DCB_DP) && dcb->version >= 0x40) {
				entry->unk04 &= ~0x30;
				entry->links = bytes[4] >> 4 & 3;
				entry->unk06 &= ~2;
			}
		} else if (dcb->version >= 0x14) {
			entry->type = bytes[0] & 0xf;
			entry->unk00_4 = bytes[0] >> 4;
			entry->i2c = (bytes[1] >> 6 & 3) | (bytes[2] << 2 & 0xc);
			entry->heads = entry->or = 1 << (bytes[2] >> 2 & 7);
			entry->loc = (bytes[2] >> 5) | (bytes[3] << 3 & 1);
			entry->conntag = bytes[3] >> 1 & 7;
			if (entry->type == ENVY_BIOS_DCB_ANALOG)
				entry->maxfreq = (bytes[6] | bytes[7] << 8) * 10;
			/* XXX */
		} else {
			/* XXX */
		}
	}
	dcb->valid = 1;
	if (envy_bios_parse_i2c(bios))
		ENVY_BIOS_ERR("Failed to parse I2C table at 0x%04x version %d.%d\n", bios->i2c.offset, bios->i2c.version >> 4, bios->i2c.version & 0xf);
	if (envy_bios_parse_gpio(bios))
		ENVY_BIOS_ERR("Failed to parse GPIO table at 0x%04x version %d.%d\n", bios->gpio.offset, bios->gpio.version >> 4, bios->gpio.version & 0xf);
	if (envy_bios_parse_inputdev(bios))
		ENVY_BIOS_ERR("Failed to parse INPUTDEV table at 0x%04x version %d.%d\n", bios->inputdev.offset, bios->inputdev.version >> 4, bios->inputdev.version & 0xf);
	if (envy_bios_parse_cinema(bios))
		ENVY_BIOS_ERR("Failed to parse CINEMA table at 0x%04x version %d.%d\n", bios->cinema.offset, bios->cinema.version >> 4, bios->cinema.version & 0xf);
	if (envy_bios_parse_spreadspectrum(bios))
		ENVY_BIOS_ERR("Failed to parse SPREADSPECTRUM table at 0x%04x version %d.%d\n", bios->spreadspectrum.offset, bios->spreadspectrum.version >> 4, bios->spreadspectrum.version & 0xf);
	if (envy_bios_parse_extdev(bios))
		ENVY_BIOS_ERR("Failed to parse EXTDEV table at 0x%04x version %d.%d\n", bios->extdev.offset, bios->extdev.version >> 4, bios->extdev.version & 0xf);
	if (envy_bios_parse_conn(bios))
		ENVY_BIOS_ERR("Failed to parse CONN table at 0x%04x version %d.%d\n", bios->conn.offset, bios->conn.version >> 4, bios->conn.version & 0xf);
	if (envy_bios_parse_hdtvtt(bios))
		ENVY_BIOS_ERR("Failed to parse HDTVTT table at 0x%04x version %d.%d\n", bios->hdtvtt.offset, bios->hdtvtt.version >> 4, bios->hdtvtt.version & 0xf);
	if (envy_bios_parse_mux(bios))
		ENVY_BIOS_ERR("Failed to parse MUX table at 0x%04x version %d.%d\n", bios->mux.offset, bios->mux.version >> 4, bios->mux.version & 0xf);
	return 0;
}